

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O0

void __thiscall
slang::ast::NetAliasVisitor::visit<slang::ast::CopyClassExpression>
          (NetAliasVisitor *this,CopyClassExpression *expr)

{
  string_view *psVar1;
  NetType *pNVar2;
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  string_view arg;
  string_view arg_00;
  string_view arg_01;
  bool bVar3;
  NetAlias *item;
  pair<unsigned_long,_unsigned_long> *ppVar4;
  SmallVectorBase<slang::ast::NetAlias> *in_RSI;
  long in_RDI;
  Type *in_stack_00000040;
  EvalContext *in_stack_00000048;
  Expression *in_stack_00000050;
  Diagnostic *diag;
  NetType *nt;
  optional<std::pair<unsigned_long,_unsigned_long>_> bounds;
  NetSymbol *netSym;
  Symbol *sym;
  NetAliasVisitor *in_stack_fffffffffffffed8;
  CopyClassExpression *in_stack_fffffffffffffee0;
  SmallVectorBase<slang::ast::NetAlias> *this_00;
  undefined4 in_stack_fffffffffffffef8;
  int iVar5;
  SourceLocation in_stack_ffffffffffffff00;
  SourceLocation in_stack_ffffffffffffff08;
  DiagCode in_stack_ffffffffffffff14;
  Diagnostic *in_stack_ffffffffffffff20;
  Expression *in_stack_ffffffffffffff28;
  size_t sVar6;
  char *in_stack_ffffffffffffff30;
  char *pcVar7;
  SmallVectorBase<slang::ast::NetAlias> *local_90;
  NetSymbol *local_88;
  not_null<const_slang::ast::ValueSymbol_*> local_80;
  not_null<const_slang::ast::Expression_*> nStack_78;
  unsigned_long local_70;
  unsigned_long local_68;
  NetSymbol *local_48;
  size_t local_40;
  char *local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined4 local_1c;
  Symbol *local_18;
  SmallVectorBase<slang::ast::NetAlias> *local_10;
  
  iVar5 = *(int *)&in_RSI->data_;
  if (iVar5 != 8) {
    if (iVar5 == 9) {
      ASTContext::addDiag((ASTContext *)CONCAT44(9,in_stack_fffffffffffffef8),(DiagCode)0x870006,
                          *(SourceRange *)(in_RSI->firstElement + 8));
      return;
    }
    if (2 < iVar5 - 0x12U) {
      CopyClassExpression::visitExprs<slang::ast::NetAliasVisitor&>
                (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
      return;
    }
  }
  local_10 = in_RSI;
  local_18 = Expression::getSymbolReference
                       (in_stack_ffffffffffffff28,SUB81((ulong)in_stack_ffffffffffffff20 >> 0x38,0))
  ;
  if (local_18 != (Symbol *)0x0) {
    if (local_18->kind == Net) {
      local_48 = Symbol::as<slang::ast::NetSymbol>((Symbol *)0x40ac4f);
      this_00 = local_10;
      ValueSymbol::getType((ValueSymbol *)0x40ac82);
      ValueDriver::getBounds(in_stack_00000050,in_stack_00000048,in_stack_00000040);
      bVar3 = std::optional::operator_cast_to_bool
                        ((optional<std::pair<unsigned_long,_unsigned_long>_> *)0x40aca9);
      if (bVar3) {
        item = (NetAlias *)(in_RDI + 0x10);
        local_88 = local_48;
        not_null<const_slang::ast::ValueSymbol_*>::not_null<const_slang::ast::NetSymbol_*>
                  (&local_80,&local_88);
        local_90 = local_10;
        not_null<const_slang::ast::Expression_*>::not_null<const_slang::ast::CopyClassExpression_*>
                  (&nStack_78,(CopyClassExpression **)&local_90);
        ppVar4 = std::optional<std::pair<unsigned_long,_unsigned_long>_>::operator*
                           ((optional<std::pair<unsigned_long,_unsigned_long>_> *)0x40ad1a);
        local_70 = ppVar4->first;
        local_68 = ppVar4->second;
        SmallVectorBase<slang::ast::NetAlias>::push_back(this_00,item);
      }
      pNVar2 = local_48->netType;
      if (*(long *)(in_RDI + 8) == 0) {
        *(NetType **)(in_RDI + 8) = pNVar2;
      }
      else if ((*(NetType **)(in_RDI + 8) != pNVar2) && ((*(byte *)(in_RDI + 0x70) & 1) == 0)) {
        sourceRange_00.endLoc = in_stack_ffffffffffffff08;
        sourceRange_00.startLoc = in_stack_ffffffffffffff00;
        ASTContext::addDiag((ASTContext *)CONCAT44(iVar5,in_stack_fffffffffffffef8),
                            in_stack_ffffffffffffff14,sourceRange_00);
        arg_00._M_str = in_stack_ffffffffffffff30;
        arg_00._M_len = (size_t)in_stack_ffffffffffffff28;
        Diagnostic::operator<<(in_stack_ffffffffffffff20,arg_00);
        psVar1 = &(pNVar2->super_Symbol).name;
        sVar6 = psVar1->_M_len;
        pcVar7 = (pNVar2->super_Symbol).name._M_str;
        Diagnostic::operator<<(in_stack_ffffffffffffff20,*psVar1);
        arg_01._M_str = pcVar7;
        arg_01._M_len = sVar6;
        Diagnostic::operator<<(*(Diagnostic **)(*(long *)(in_RDI + 8) + 0x10),arg_01);
        *(undefined1 *)(in_RDI + 0x70) = 1;
      }
    }
    else {
      local_1c = 0x880006;
      local_30 = *(undefined8 *)(local_10->firstElement + 8);
      local_28 = *(undefined8 *)(local_10->firstElement + 0x10);
      sourceRange.endLoc = in_stack_ffffffffffffff08;
      sourceRange.startLoc = in_stack_ffffffffffffff00;
      ASTContext::addDiag((ASTContext *)CONCAT44(iVar5,in_stack_fffffffffffffef8),
                          in_stack_ffffffffffffff14,sourceRange);
      local_40 = (local_18->name)._M_len;
      local_38 = (local_18->name)._M_str;
      arg._M_str = in_stack_ffffffffffffff30;
      arg._M_len = (size_t)in_stack_ffffffffffffff28;
      Diagnostic::operator<<(in_stack_ffffffffffffff20,arg);
    }
  }
  return;
}

Assistant:

void visit(const T& expr) {
        if constexpr (std::is_base_of_v<Expression, T>) {
            switch (expr.kind) {
                case ExpressionKind::NamedValue:
                case ExpressionKind::MemberAccess:
                case ExpressionKind::ElementSelect:
                case ExpressionKind::RangeSelect: {
                    if (auto sym = expr.getSymbolReference()) {
                        if (sym->kind != SymbolKind::Net) {
                            context.addDiag(diag::NetAliasNotANet, expr.sourceRange) << sym->name;
                        }
                        else {
                            auto& netSym = sym->template as<NetSymbol>();
                            if (auto bounds = ValueDriver::getBounds(expr, evalCtx,
                                                                     netSym.getType())) {
                                netAliases.push_back({&netSym, &expr, *bounds});
                            }

                            auto& nt = netSym.netType;
                            if (!commonNetType) {
                                commonNetType = &nt;
                            }
                            else if (commonNetType != &nt && !issuedError) {
                                auto& diag = context.addDiag(diag::NetAliasCommonNetType,
                                                             expr.sourceRange);
                                diag << sym->name;
                                diag << nt.name << commonNetType->name;
                                issuedError = true;
                            }
                        }
                    }
                    break;
                }
                case ExpressionKind::HierarchicalValue:
                    context.addDiag(diag::NetAliasHierarchical, expr.sourceRange);
                    break;
                default:
                    if constexpr (HasVisitExprs<T, NetAliasVisitor>)
                        expr.visitExprs(*this);
                    break;
            }
        }
    }